

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

void bov_window_screenshot(bov_window_t *window,char *filename)

{
  uint uVar1;
  uchar *puVar2;
  FILE *__stream;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (window == (bov_window_t *)0x0 || filename == (char *)0x0) {
    free(bov_window_screenshot::data);
    return;
  }
  uVar1 = (uint)(window->param).res[0];
  uVar3 = (uint)(window->param).res[1];
  uVar6 = (long)(int)uVar1 * 3 + 3;
  uVar5 = uVar6 & 0xfffffffffffffffc;
  puVar2 = (uchar *)realloc(bov_window_screenshot::data,(long)(int)uVar3 * uVar5);
  if (puVar2 == (uchar *)0x0) {
    bov_error_log(0x30001,"Memory allocation failed");
    fprintf(_stderr,"\t(in function %s, line %d)\n","bov_window_screenshot",0x62d);
  }
  else {
    bov_window_screenshot::data = puVar2;
    __stream = fopen(filename,"wb");
    if (__stream != (FILE *)0x0) {
      (*glad_glReadBuffer)(0x404);
      (*glad_glReadPixels)(0,0,uVar1,uVar3,0x1907,0x1401,bov_window_screenshot::data);
      fprintf(__stream,"P6\n%d %d\n255\n",(ulong)uVar1,(ulong)uVar3);
      lVar4 = ((ulong)uVar3 - 1) * (uVar6 >> 2) * 4;
      for (; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
        fwrite(bov_window_screenshot::data + lVar4,1,(long)(int)uVar1 * 3,__stream);
        lVar4 = lVar4 - uVar5;
      }
      fclose(__stream);
      return;
    }
  }
  exit(1);
}

Assistant:

void bov_window_screenshot(const bov_window_t* window,
                           const char* filename)
{
	static unsigned char* data = NULL;

	if(window==NULL || filename==NULL) {
		free(data);
		return;
	}

	int width = (int) window->param.res[0];
	int height = (int) window->param.res[1];

	size_t rowsize = ((size_t) width * 3 + 3) / 4 * 4; // width of a row in byte
	void* newData = realloc(data, rowsize*height); // width is rounded to multiple of four
	CHECK_MALLOC(newData);
	data = newData; // just for MSVC to be happy

	FILE* pFile;

	pFile=fopen(filename, "wb");
	if(pFile==NULL)
		exit(1);

	glReadBuffer( GL_FRONT );
	glReadPixels( 0, 0, width, height, GL_RGB, GL_UNSIGNED_BYTE, data );

	// Write header
	fprintf(pFile, "P6\n%d %d\n255\n", width, height);

	// Write pixel data
	for(int i=height-1; i>=0; i--) {
		unsigned char *row = data + rowsize*i;
		fwrite(row, 1, (size_t) width*3, pFile);
	}

	// Close file
	fclose(pFile);
}